

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

bool __thiscall Json::StyledStreamWriter::isMultilineArray(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  int iVar3;
  Value *pVVar4;
  bool local_43;
  byte local_42;
  byte local_41;
  uint local_38;
  uint local_34;
  ArrayIndex index_1;
  ArrayIndex lineLength;
  Value *childValue;
  bool local_1d;
  ArrayIndex index;
  bool isMultiLine;
  ArrayIndex size;
  Value *value_local;
  StyledStreamWriter *this_local;
  
  AVar2 = Value::size(value);
  local_1d = this->rightMargin_ <= AVar2 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  childValue._4_4_ = 0;
  do {
    local_41 = 0;
    if (childValue._4_4_ < AVar2) {
      local_41 = local_1d ^ 0xff;
    }
    if ((local_41 & 1) == 0) {
      if (local_1d == false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(ulong)AVar2);
        this->field_0x68 = this->field_0x68 & 0xfe | 1;
        local_34 = (AVar2 - 1) * 2 + 4;
        for (local_38 = 0; local_38 < AVar2; local_38 = local_38 + 1) {
          pVVar4 = Value::operator[](value,local_38);
          bVar1 = hasCommentForValue(pVVar4);
          if (bVar1) {
            local_1d = true;
          }
          pVVar4 = Value::operator[](value,local_38);
          writeValue(this,pVVar4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->childValues_,(ulong)local_38);
          iVar3 = std::__cxx11::string::length();
          local_34 = iVar3 + local_34;
        }
        this->field_0x68 = this->field_0x68 & 0xfe;
        local_43 = true;
        if (local_1d == false) {
          local_43 = this->rightMargin_ <= local_34;
        }
        local_1d = local_43;
      }
      return local_1d;
    }
    pVVar4 = Value::operator[](value,childValue._4_4_);
    bVar1 = Value::isArray(pVVar4);
    if (bVar1) {
LAB_009e5c15:
      bVar1 = Value::empty(pVVar4);
      local_42 = bVar1 ^ 0xff;
    }
    else {
      bVar1 = Value::isObject(pVVar4);
      local_42 = 0;
      if (bVar1) goto LAB_009e5c15;
    }
    local_1d = (bool)(local_42 & 1);
    childValue._4_4_ = childValue._4_4_ + 1;
  } while( true );
}

Assistant:

bool StyledStreamWriter::isMultilineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                   !childValue.empty());
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}